

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O0

OceanWave * InitializeWave(double SR,float attackInSeconds,float maxLevel,float positionLeftRight)

{
  int iVar1;
  uint numRows;
  OceanWave *pink;
  float fVar2;
  uint newNoOfRows;
  OceanWave *wave;
  float positionLeftRight_local;
  float maxLevel_local;
  float attackInSeconds_local;
  double SR_local;
  
  pink = (OceanWave *)PaUtil_AllocateMemory(0x250);
  if (pink != (OceanWave *)0x0) {
    InitializePinkNoise((PinkNoise *)pink,InitializeWave::lastNoOfRows);
    do {
      iVar1 = rand();
      numRows = (iVar1 << 3) / 0x7fffffff + 0xc;
    } while (numRows == InitializeWave::lastNoOfRows);
    InitializePinkNoise(&pink->wave_right,numRows);
    InitializeWave::lastNoOfRows = numRows;
    pink->wave_envelope_state = State_kAttack;
    pink->wave_envelope_level = 0.0;
    pink->wave_envelope_max_level = maxLevel;
    pink->wave_attack_incr = pink->wave_envelope_max_level / (attackInSeconds * (float)SR);
    pink->wave_decay_incr = -pink->wave_envelope_max_level / (attackInSeconds * 4.0 * (float)SR);
    fVar2 = sqrtf(1.0 - positionLeftRight);
    pink->wave_pan_left = fVar2;
    fVar2 = sqrtf(positionLeftRight);
    pink->wave_pan_right = fVar2;
  }
  return pink;
}

Assistant:

OceanWave* InitializeWave(double SR, float attackInSeconds, float maxLevel, float positionLeftRight)
{
    OceanWave* wave = NULL;
    static unsigned lastNoOfRows = 12;
    unsigned newNoOfRows;

    wave = (OceanWave*)PaUtil_AllocateMemory(sizeof(OceanWave));
    if (wave != NULL)
    {
        InitializePinkNoise(&wave->wave_left, lastNoOfRows);
        while ((newNoOfRows = NEW_ROW_SIZE) == lastNoOfRows);
        InitializePinkNoise(&wave->wave_right, newNoOfRows);
        lastNoOfRows = newNoOfRows;

        wave->wave_envelope_state = State_kAttack;
        wave->wave_envelope_level = 0.f;
        wave->wave_envelope_max_level = maxLevel;
        wave->wave_attack_incr = wave->wave_envelope_max_level / (attackInSeconds * (float)SR);
        wave->wave_decay_incr = - wave->wave_envelope_max_level / (attackInSeconds * 4 * (float)SR);

        wave->wave_pan_left = sqrtf(1.0f - positionLeftRight);
        wave->wave_pan_right = sqrtf(positionLeftRight);
    }
    return wave;
}